

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall
H264StreamReader::getTSDescriptor
          (H264StreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  bool interlaced;
  uint width;
  uint height;
  VideoAspectRatio ar;
  double fps;
  byte local_101;
  uint8_t local_f1;
  byte *pbStack_c8;
  NALType nalType;
  uint8_t *nal;
  uint8_t local_b7;
  byte local_b6;
  uint8_t local_b5 [6];
  uint8_t aspect_ratio_index;
  uint8_t frame_rate_index;
  uint8_t video_format;
  undefined1 local_a8 [8];
  SliceUnit slice;
  bool hdmvDescriptors_local;
  bool blurayMode_local;
  uint8_t *dstBuff_local;
  H264StreamReader *this_local;
  
  slice.sps._6_1_ = hdmvDescriptors;
  slice.sps._7_1_ = blurayMode;
  SliceUnit::SliceUnit((SliceUnit *)local_a8);
  if ((this->m_firstDecodeNal & 1U) != 0) {
    additionalStreamCheck
              (this,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer,
               (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
    this->m_firstDecodeNal = false;
  }
  if ((slice.sps._6_1_ & 1) == 0) {
    pbStack_c8 = NALUnit::findNextNAL
                           ((this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer,
                            (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
    while( true ) {
      if ((this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd + -4 <= pbStack_c8) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/h264StreamReader.cpp"
                      ,0x1de,
                      "virtual int H264StreamReader::getTSDescriptor(uint8_t *, bool, const bool)");
      }
      if (((*pbStack_c8 & 0x1f) == 7) || ((*pbStack_c8 & 0x1f) == 0xf)) break;
      pbStack_c8 = NALUnit::findNextNAL
                             (pbStack_c8,
                              (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
    }
    processSPS(this,pbStack_c8);
    *dstBuff = '(';
    dstBuff[1] = '\x04';
    dstBuff[2] = pbStack_c8[1];
    dstBuff[3] = pbStack_c8[2];
    if (this->m_forcedLevel == '\0') {
      local_101 = pbStack_c8[3];
    }
    else {
      local_101 = this->m_forcedLevel;
    }
    dstBuff[4] = local_101;
    dstBuff[5] = 0xbf;
    this_local._4_4_ = 6;
  }
  else {
    *dstBuff = '\x05';
    dstBuff[1] = '\b';
    dstBuff[2] = 'H';
    dstBuff[3] = 'D';
    dstBuff[4] = 'M';
    dstBuff[5] = 'V';
    dstBuff[6] = 0xff;
    fps = MPEGStreamReader::getFPS(&this->super_MPEGStreamReader);
    interlaced = getInterlaced(this);
    width = getStreamWidth(this);
    height = getStreamHeight(this);
    ar = MPEGStreamReader::getStreamAR(&this->super_MPEGStreamReader);
    M2TSStreamInfo::blurayStreamParams(fps,interlaced,width,height,ar,local_b5,&local_b6,&local_b7);
    local_f1 = '\x1b';
    if (((this->m_mvcSubStream ^ 0xffU) & 1) == 0) {
      local_f1 = ' ';
    }
    dstBuff[7] = local_f1;
    dstBuff[8] = local_b5[0] << 4 | local_b6;
    dstBuff[9] = local_b7 << 4 | 0xf;
    this_local._4_4_ = 10;
  }
  SliceUnit::~SliceUnit((SliceUnit *)local_a8);
  return this_local._4_4_;
}

Assistant:

int H264StreamReader::getTSDescriptor(uint8_t *dstBuff, bool blurayMode, const bool hdmvDescriptors)
{
    SliceUnit slice;
    if (m_firstDecodeNal)
    {
        additionalStreamCheck(m_buffer, m_bufEnd);
        m_firstDecodeNal = false;
    }

    if (hdmvDescriptors)
    {
        // Blu-ray core specifications Table 9-10 - HDMV_video_registration_descriptor
        *dstBuff++ = static_cast<int>(TSDescriptorTag::REGISTRATION);  // descriptor tag
        *dstBuff++ = 8;                                                // descriptor length
        *dstBuff++ = 'H';
        *dstBuff++ = 'D';
        *dstBuff++ = 'M';
        *dstBuff++ = 'V';
        *dstBuff++ = 0xff;  // stuffing byte

        uint8_t video_format, frame_rate_index, aspect_ratio_index;
        M2TSStreamInfo::blurayStreamParams(getFPS(), getInterlaced(), getStreamWidth(), getStreamHeight(),
                                           getStreamAR(), &video_format, &frame_rate_index, &aspect_ratio_index);
        *dstBuff++ = !m_mvcSubStream ? static_cast<uint8_t>(StreamType::VIDEO_H264)
                                     : static_cast<uint8_t>(StreamType::VIDEO_MVC);  // stream_coding_type
        *dstBuff++ = static_cast<uint8_t>(video_format << 4 | frame_rate_index);     // video_format + frame_rate
        *dstBuff = static_cast<uint8_t>(aspect_ratio_index << 4 | 0xf);              // aspect ratio + stuffing_bits

        return 10;  // total descriptor length
    }

    // Not HDMV => AVC video descriptor according to H.222 Table 2-92
    // find SPS
    for (uint8_t *nal = NALUnit::findNextNAL(m_buffer, m_bufEnd); nal < m_bufEnd - 4;
         nal = NALUnit::findNextNAL(nal, m_bufEnd))
    {
        const auto nalType = static_cast<NALUnit::NALType>(*nal & 0x1f);
        if (nalType == NALUnit::NALType::nuSPS || nalType == NALUnit::NALType::nuSubSPS)
        {
            processSPS(nal);
            *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::AVC);   // descriptor tag
            *dstBuff++ = 4;                                            // descriptor length
            *dstBuff++ = nal[1];                                       // profile_idc
            *dstBuff++ = nal[2];                                       // constraint flags
            *dstBuff++ = m_forcedLevel == 0 ? nal[3] : m_forcedLevel;  // level_idc
            *dstBuff = 0xbf;  // AVC_still_present, AVC_24_hour flag, Frame_Packing_SEI_not_present_flag, reserved

            return 6;
        }
    }
    // avoid compiler warning: control reaches end of non-void function
    assert(0);  // no SPS nal: exit
    return 0;
}